

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dti.cpp
# Opt level: O2

bool ReadDTI(MemFile *file,shared_ptr<Disk> *disk)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  int size_;
  ssize_t sVar4;
  exception *peVar5;
  size_t in_RCX;
  size_t __nbytes;
  uint head_;
  uint cyl_;
  allocator_type local_e9;
  DTI_HEADER dh;
  CylHead cylhead;
  int uDataLen;
  int uBlock;
  shared_ptr<Disk> *local_d0;
  MEMORY mem;
  Track track;
  Data data;
  Sector sector;
  
  local_d0 = disk;
  MemFile::rewind(file,(FILE *)disk);
  sVar4 = MemFile::read(file,(int)&dh,(void *)0x8,in_RCX);
  if (((char)sVar4 == '\0') || (dh.abSignature != (char  [4])0x32473248)) {
    bVar3 = false;
  }
  else {
    __nbytes = 0x200;
    Format::Validate((uint)dh.bTracks,(uint)dh.bSides,1,0x200,0);
    uBlock = (int)(ushort)dh._6_2_;
    if (uBlock != 0x900) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[31],int&,char_const(&)[2]>
                (peVar5,(char (*) [31])"unsupported track block size (",&uBlock,
                 (char (*) [2])0x1a9e10);
      __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
    mem.size = 0x900;
    mem.pb = AllocMem(0x900);
    for (head_ = 0; head_ < dh.bSides; head_ = head_ + 1) {
      for (cyl_ = 0; cyl_ < dh.bTracks; cyl_ = cyl_ + 1) {
        CylHead::CylHead(&cylhead,cyl_,head_);
        sVar4 = MemFile::read(file,(int)mem.pb,(void *)0x900,__nbytes);
        if ((char)sVar4 == '\0') {
          peVar5 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[22],CylHead&>
                    (peVar5,(char (*) [22])"short file reading %s",&cylhead);
          __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar1 = *mem.pb;
        uVar2 = *(ushort *)(mem.pb + 1);
        uDataLen = (int)uVar2;
        if (0x8fd < (uint)uDataLen) {
          peVar5 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[22],int&,char_const(&)[6],CylHead&>
                    (peVar5,(char (*) [22])"invalid data length (",&uDataLen,(char (*) [6])") on ",
                     &cylhead);
          __cxa_throw(peVar5,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        Track::Track(&track,1);
        if (uVar2 != 0) {
          size_ = SizeToCode(0x1000);
          Header::Header((Header *)&data,&cylhead,0,size_);
          Sector::Sector(&sector,_250K,Ace,(Header *)&data,0);
          std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,mem.pb + 2,
                     mem.pb + (ulong)(uint)uVar2 + 2,&local_e9);
          __nbytes = 0xfb;
          Sector::add(&sector,&data,(bool)(bVar1 & 1),0xfb);
          Track::add(&track,&sector);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
          std::vector<Data,_std::allocator<Data>_>::~vector(&sector.m_data);
        }
        Disk::write((local_d0->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                    (int)&cylhead,&track,__nbytes);
        std::vector<Sector,_std::allocator<Sector>_>::~vector(&track.m_sectors);
      }
    }
    std::__cxx11::string::assign
              ((char *)&((local_d0->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                        strType);
    MEMORY::~MEMORY(&mem);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ReadDTI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    file.rewind();

    DTI_HEADER dh;
    if (!file.read(&dh, sizeof(dh)) || memcmp(dh.abSignature, DTI_SIGNATURE, sizeof(dh.abSignature)))
        return false;

    Format::Validate(dh.bTracks, dh.bSides);

    auto uBlock = (dh.bBlockHigh << 8) | dh.bBlockLow;
    if (uBlock != DTI_BLOCK_SIZE)
        throw util::exception("unsupported track block size (", uBlock, ")");

    MEMORY mem(uBlock);

    for (uint8_t head = 0; head < dh.bSides; head++)
    {
        for (uint8_t cyl = 0; cyl < dh.bTracks; cyl++)
        {
            CylHead cylhead(cyl, head);

            if (!file.read(mem, uBlock))
                throw util::exception("short file reading %s", cylhead);

            uint8_t flags = mem[0];
            auto uDataLen = (mem[2] << 8) | mem[1];
            if (uDataLen > uBlock - static_cast<int>(sizeof(DTI_TRACK)))
                throw util::exception("invalid data length (", uDataLen, ") on ", cylhead);

            Track track(1);
            if (uDataLen)
            {
                bool bad_data_crc = (flags & 1) != 0;
                Sector sector(DataRate::_250K, Encoding::Ace, Header(cylhead, 0, SizeToCode(4096)));
                Data data(mem.pb + 2, mem.pb + 2 + uDataLen);
                sector.add(std::move(data), bad_data_crc);
                track.add(std::move(sector));
            }

            disk->write(cylhead, std::move(track));
        }
    }

    disk->strType = "DTI";
    return true;
}